

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O3

void __thiscall CMU462::Application::set_up_pathtracer(Application *this)

{
  PathTracer *this_00;
  Scene *this_01;
  int iVar1;
  Scene *scene;
  
  if ((*(uint *)&(this->super_Renderer).field_0xc & 0xfffffffd) == 0) {
    PathTracer::set_camera(this->pathtracer,&this->camera);
    this_00 = this->pathtracer;
    this_01 = this->scene;
    if (this->action == Raytrace_Video) {
      iVar1 = Timeline::getCurrentFrame(&this->timeline);
      scene = DynamicScene::Scene::get_transformed_static_scene(this_01,(double)iVar1);
    }
    else {
      scene = DynamicScene::Scene::get_static_scene(this_01);
    }
    PathTracer::set_scene(this_00,scene);
    PathTracer::set_frame_size(this->pathtracer,this->screenW,this->screenH);
    return;
  }
  return;
}

Assistant:

void Application::set_up_pathtracer() {
  if (mode != MODEL_MODE && mode != ANIMATE_MODE) return;
  pathtracer->set_camera(&camera);
  if (action == Action::Raytrace_Video) {
    pathtracer->set_scene(
        scene->get_transformed_static_scene(timeline.getCurrentFrame()));
  } else {
    pathtracer->set_scene(scene->get_static_scene());
  }
  pathtracer->set_frame_size(screenW, screenH);
}